

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.h
# Opt level: O1

TestResult *
JsonTest::checkEqual<int,unsigned_int>
          (TestResult *result,int expected,uint actual,char *file,uint line,char *expr)

{
  undefined8 in_RAX;
  TestResult *pTVar1;
  uint local_18;
  uint local_14;
  
  _local_18 = CONCAT44((uint)((ulong)in_RAX >> 0x20),actual);
  if (expected != actual) {
    TestResult::addFailure(result,file,line,expr);
    pTVar1 = TestResult::operator<<(result,(char (*) [11])"Expected: ");
    _local_18 = CONCAT44(expected,local_18);
    pTVar1 = TestResult::operator<<(pTVar1,&local_14);
    TestResult::operator<<(pTVar1,(char (*) [2])0x14814f);
    pTVar1 = TestResult::operator<<(result,(char (*) [11])"Actual  : ");
    TestResult::operator<<(pTVar1,&local_18);
  }
  return result;
}

Assistant:

TestResult& checkEqual(TestResult& result,
                       T expected,
                       U actual,
                       const char* file,
                       unsigned int line,
                       const char* expr) {
  if (static_cast<U>(expected) != actual) {
    result.addFailure(file, line, expr);
    result << "Expected: " << static_cast<U>(expected) << "\n";
    result << "Actual  : " << actual;
  }
  return result;
}